

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O2

Token * __thiscall embree::TokenStream::next(Token *__return_storage_ptr__,TokenStream *this)

{
  bool bVar1;
  int iVar2;
  ParseLocation *pPVar3;
  int *piVar4;
  ParseLocation loc;
  Token token;
  ParseLocation local_88;
  Token local_60;
  
  local_88.fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_88.fileName.
  super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_88.lineNumber._0_4_ = 0xffffffff;
  local_88.lineNumber._4_4_ = 0xffffffff;
  local_88.colNumber._0_4_ = 0xffffffff;
  local_88.colNumber._4_4_ = 0xffffffff;
  Token::Token(&local_60,&local_88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  skipSeparators(this);
  pPVar3 = Stream<int>::loc((this->cin).ptr);
  ParseLocation::ParseLocation(&local_88,pPVar3);
  bVar1 = trySymbols(this,&local_60,&local_88);
  if (!bVar1) {
    bVar1 = tryFloat(this,&local_60,&local_88);
    if (!bVar1) {
      bVar1 = tryInt(this,&local_60,&local_88);
      if (!bVar1) {
        bVar1 = tryString(this,&local_60,&local_88);
        if (!bVar1) {
          bVar1 = tryIdentifier(this,&local_60,&local_88);
          if (!bVar1) {
            piVar4 = Stream<int>::peek((this->cin).ptr);
            if (*piVar4 == -1) {
              Token::Token(__return_storage_ptr__,&local_88);
            }
            else {
              iVar2 = Stream<int>::get((this->cin).ptr);
              Token::Token(__return_storage_ptr__,(char)iVar2,&local_88);
            }
            goto LAB_001ba2c3;
          }
        }
      }
    }
  }
  Token::Token(__return_storage_ptr__,&local_60);
LAB_001ba2c3:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_88.fileName.
              super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  Token::~Token(&local_60);
  return __return_storage_ptr__;
}

Assistant:

Token TokenStream::next()
  {
    Token token;
    skipSeparators();
    ParseLocation loc = cin->loc();
    if (trySymbols   (token,loc)) return token;      /**< try to parse a symbol */
    if (tryFloat     (token,loc)) return token;      /**< try to parse float */
    if (tryInt       (token,loc)) return token;      /**< try to parse integer */
    if (tryString    (token,loc)) return token;      /**< try to parse string */
    if (tryIdentifier(token,loc)) return token;      /**< try to parse identifier */
    if (cin->peek() == EOF  )     return Token(loc); /**< return EOF token */
    return Token((char)cin->get(),loc);              /**< return invalid character token */
  }